

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O3

duration<long,_boost::ratio<1L,_1L>_> __thiscall
hungarian_algorithm::
BruteForceSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>,unsigned_long>
::getAssignment<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (BruteForceSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>,unsigned_long>
           *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map)

{
  long lVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  value_type local_18;
  
  local_18 = *(value_type *)(this + 0x20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_fill_assign
            (assignment_map,*(size_type *)(this + 0x18),&local_18);
  uVar4 = *(ulong *)(this + 0x18);
  if (uVar4 != 0) {
    lVar1 = *(long *)(this + 0x40);
    puVar2 = (assignment_map->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      uVar3 = *(ulong *)(lVar1 + uVar5 * 8);
      if (uVar3 < *(ulong *)(this + 0x20)) {
        puVar2[uVar5] = uVar3;
        uVar4 = *(ulong *)(this + 0x18);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  return (duration<long,_boost::ratio<1L,_1L>_>)*(rep *)(this + 0x88);
}

Assistant:

Cost getAssignment(AssignmentMap& assignment_map)
  {
    // Fill assignment map and compute total cost of assignment:
    AssignmentMapAdapter<Size, AssignmentMap> assignment_map_adapter(assignment_map, Size(num_rows_), Size(num_cols_));
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      const std::size_t col = optimal_assignment_[row];
      if (col < num_cols_)
      {
        assignment_map_adapter.insert(Size(row), Size(col));
      }
    }
    return optimal_cost_.second;
  }